

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_scriptutil.cpp
# Opt level: O3

void __thiscall
ScriptUtil_CreateMultisigRedeemScriptTest_Test::TestBody
          (ScriptUtil_CreateMultisigRedeemScriptTest_Test *this)

{
  vector<cfd::core::Pubkey,_std::allocator<cfd::core::Pubkey>_> *this_00;
  Script *this_01;
  void *pvVar1;
  pointer pcVar2;
  undefined8 lhs;
  bool bVar3;
  long lVar4;
  char *message;
  undefined1 *puVar5;
  pointer pMVar6;
  initializer_list<cfd::core::Pubkey> __l;
  initializer_list<cfd::core::Pubkey> __l_00;
  initializer_list<cfd::core::Pubkey> __l_01;
  initializer_list<cfd::core::Pubkey> __l_02;
  initializer_list<cfd::core::Pubkey> __l_03;
  initializer_list<cfd::core::Pubkey> __l_04;
  initializer_list<MultisigTestVector> __l_05;
  AssertionResult gtest_ar;
  vector<MultisigTestVector,_std::allocator<MultisigTestVector>_> test_vectors;
  AssertionResult gtest_ar_1;
  MultisigTestVector test_vector;
  Script actual;
  allocator_type local_104f;
  allocator_type local_104e;
  allocator_type local_104d;
  allocator_type local_104c;
  allocator_type local_104b;
  allocator_type local_104a;
  allocator_type local_1049;
  string local_1048;
  string local_1028;
  string local_1008;
  string local_fe8;
  string local_fc8;
  string local_fa8;
  Pubkey local_f88;
  Pubkey local_f70;
  Pubkey local_f58;
  string local_f40;
  string local_f20;
  string local_f00;
  string local_ee0;
  string local_ec0;
  string local_ea0;
  string local_e80;
  string local_e60;
  string local_e40;
  string local_e20;
  string local_e00;
  string local_de0;
  string local_dc0;
  string local_da0;
  string local_d80;
  string local_d60;
  string local_d40;
  string local_d20;
  string local_d00;
  string local_ce0;
  string local_cc0;
  string local_ca0;
  string local_c80;
  string local_c60;
  string local_c40;
  string local_c20;
  string local_c00;
  string local_be0;
  string local_bc0;
  string local_ba0;
  string local_b80;
  string local_b60;
  string local_b40;
  string local_b20;
  string local_b00;
  string local_ae0;
  string local_ac0;
  string local_aa0;
  string local_a80;
  string local_a60;
  string local_a40;
  string local_a20;
  string local_a00;
  string local_9e0;
  string local_9c0;
  string local_9a0;
  string local_980;
  string local_960;
  string local_940;
  string local_920;
  string local_900;
  string local_8e0;
  string local_8c0;
  string local_8a0;
  string local_880;
  string local_860;
  vector<MultisigTestVector,_std::allocator<MultisigTestVector>_> local_840;
  Pubkey local_828;
  Pubkey local_810;
  Pubkey local_7f8;
  undefined1 local_7e0 [72];
  Pubkey local_798;
  Pubkey local_780;
  Pubkey local_768;
  Pubkey local_750;
  Pubkey local_738;
  Pubkey local_720;
  Pubkey local_708;
  Pubkey local_6f0;
  Pubkey local_6d8;
  Pubkey local_6c0;
  Pubkey local_6a8;
  Pubkey local_690;
  undefined1 local_678 [48];
  Pubkey local_648;
  Pubkey local_630;
  Pubkey local_618;
  Pubkey local_600;
  Pubkey local_5e8;
  Pubkey local_5d0;
  Pubkey local_5b8;
  Pubkey local_5a0;
  Pubkey local_588;
  Pubkey local_570;
  Pubkey local_558;
  Pubkey local_540;
  Pubkey local_528;
  undefined1 local_510 [88];
  _Alloc_hider local_4b8;
  char local_4a8 [16];
  bool local_498;
  undefined4 local_490;
  vector<cfd::core::Pubkey,_std::allocator<cfd::core::Pubkey>_> local_488;
  Script local_470;
  undefined1 *local_438 [2];
  undefined1 local_428 [16];
  undefined1 local_418;
  undefined4 local_410;
  vector<cfd::core::Pubkey,_std::allocator<cfd::core::Pubkey>_> local_408;
  Script local_3f0;
  undefined1 *local_3b8 [2];
  undefined1 local_3a8 [16];
  undefined1 local_398;
  undefined4 local_390;
  vector<cfd::core::Pubkey,_std::allocator<cfd::core::Pubkey>_> local_388;
  Script local_370;
  undefined1 *local_338 [2];
  undefined1 local_328 [16];
  undefined1 local_318;
  undefined4 local_310;
  vector<cfd::core::Pubkey,_std::allocator<cfd::core::Pubkey>_> local_308;
  Script local_2f0;
  undefined1 *local_2b8 [2];
  undefined1 local_2a8 [16];
  undefined1 local_298;
  undefined4 local_290;
  vector<cfd::core::Pubkey,_std::allocator<cfd::core::Pubkey>_> local_288;
  Script local_270;
  undefined1 *local_238 [2];
  undefined1 local_228 [16];
  undefined1 local_218;
  undefined1 local_210 [72];
  Pubkey local_1c8;
  Pubkey local_1b0;
  Pubkey local_198;
  Pubkey local_180;
  Pubkey local_168;
  Pubkey local_150;
  Pubkey local_138;
  Pubkey local_120;
  Pubkey local_108;
  Pubkey local_f0;
  Pubkey local_d8;
  Pubkey local_c0;
  Pubkey local_a8;
  Pubkey local_90;
  Pubkey local_78;
  Pubkey local_60;
  Pubkey local_48;
  
  local_510._0_4_ = 1;
  local_860._M_dataplus._M_p = (pointer)&local_860.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_860,
             "02522952c3fc2a53a8651b08ce10988b7506a3b40a5c26f9648a911be33e73e1a0","");
  cfd::core::Pubkey::Pubkey(&local_828,&local_860);
  __l._M_len = 1;
  __l._M_array = &local_828;
  std::vector<cfd::core::Pubkey,_std::allocator<cfd::core::Pubkey>_>::vector
            ((vector<cfd::core::Pubkey,_std::allocator<cfd::core::Pubkey>_> *)(local_510 + 8),__l,
             &local_1049);
  local_fa8._M_dataplus._M_p = (pointer)&local_fa8.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_fa8,
             "512102522952c3fc2a53a8651b08ce10988b7506a3b40a5c26f9648a911be33e73e1a051ae","");
  cfd::core::Script::Script((Script *)(local_510 + 0x20),&local_fa8);
  local_4b8._M_p = local_4a8;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_4b8,"");
  local_498 = false;
  local_490 = 1;
  local_880._M_dataplus._M_p = (pointer)&local_880.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_880,
             "02522952c3fc2a53a8651b08ce10988b7506a3b40a5c26f9648a911be33e73e1a0","");
  cfd::core::Pubkey::Pubkey(&local_810,&local_880);
  local_8a0._M_dataplus._M_p = (pointer)&local_8a0.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_8a0,
             "0340b52ae45bc1be5de083f1730fe537374e219c4836400623741d2a874e60590c","");
  cfd::core::Pubkey::Pubkey(&local_7f8,&local_8a0);
  __l_00._M_len = 2;
  __l_00._M_array = &local_810;
  std::vector<cfd::core::Pubkey,_std::allocator<cfd::core::Pubkey>_>::vector
            (&local_488,__l_00,&local_104a);
  local_fc8._M_dataplus._M_p = (pointer)&local_fc8.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_fc8,
             "512102522952c3fc2a53a8651b08ce10988b7506a3b40a5c26f9648a911be33e73e1a0210340b52ae45bc1be5de083f1730fe537374e219c4836400623741d2a874e60590c52ae"
             ,"");
  cfd::core::Script::Script(&local_470,&local_fc8);
  local_438[0] = local_428;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_438,"");
  local_418 = 0;
  local_410 = 2;
  local_8c0._M_dataplus._M_p = (pointer)&local_8c0.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_8c0,
             "02522952c3fc2a53a8651b08ce10988b7506a3b40a5c26f9648a911be33e73e1a0","");
  cfd::core::Pubkey::Pubkey(&local_f88,&local_8c0);
  local_8e0._M_dataplus._M_p = (pointer)&local_8e0.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_8e0,
             "0340b52ae45bc1be5de083f1730fe537374e219c4836400623741d2a874e60590c","");
  cfd::core::Pubkey::Pubkey(&local_f70,&local_8e0);
  local_900._M_dataplus._M_p = (pointer)&local_900.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_900,
             "024a3477bc8b933a320eb5667ee72c35a81aa155c8e20cc51c65fb666de3a43b82","");
  cfd::core::Pubkey::Pubkey(&local_f58,&local_900);
  __l_01._M_len = 3;
  __l_01._M_array = &local_f88;
  std::vector<cfd::core::Pubkey,_std::allocator<cfd::core::Pubkey>_>::vector
            (&local_408,__l_01,&local_104b);
  local_fe8._M_dataplus._M_p = (pointer)&local_fe8.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_fe8,
             "522102522952c3fc2a53a8651b08ce10988b7506a3b40a5c26f9648a911be33e73e1a0210340b52ae45bc1be5de083f1730fe537374e219c4836400623741d2a874e60590c21024a3477bc8b933a320eb5667ee72c35a81aa155c8e20cc51c65fb666de3a43b8253ae"
             ,"");
  cfd::core::Script::Script(&local_3f0,&local_fe8);
  local_3b8[0] = local_3a8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_3b8,"");
  local_398 = 0;
  local_390 = 0xc;
  local_920._M_dataplus._M_p = (pointer)&local_920.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_920,
             "02522952c3fc2a53a8651b08ce10988b7506a3b40a5c26f9648a911be33e73e1a0","");
  cfd::core::Pubkey::Pubkey((Pubkey *)local_7e0,&local_920);
  local_940._M_dataplus._M_p = (pointer)&local_940.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_940,
             "0340b52ae45bc1be5de083f1730fe537374e219c4836400623741d2a874e60590c","");
  cfd::core::Pubkey::Pubkey((Pubkey *)(local_7e0 + 0x18),&local_940);
  local_960._M_dataplus._M_p = (pointer)&local_960.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_960,
             "024a3477bc8b933a320eb5667ee72c35a81aa155c8e20cc51c65fb666de3a43b82","");
  cfd::core::Pubkey::Pubkey((Pubkey *)(local_7e0 + 0x30),&local_960);
  local_980._M_dataplus._M_p = (pointer)&local_980.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_980,
             "03ce982e13798960b7c23fd2c1676f64ff6df80f75324d0e566432e2a884dafb38","");
  cfd::core::Pubkey::Pubkey(&local_798,&local_980);
  local_9a0._M_dataplus._M_p = (pointer)&local_9a0.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_9a0,
             "020bac40bcc23dd9b33a32b8183d2e9e79eb976bcfb2247141da1e58b2970bfde1","");
  cfd::core::Pubkey::Pubkey(&local_780,&local_9a0);
  local_9c0._M_dataplus._M_p = (pointer)&local_9c0.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_9c0,
             "0289d8f0fb8cbd369a9aad28070edf2e99544384c122b8af825e50ea219193f147","");
  cfd::core::Pubkey::Pubkey(&local_768,&local_9c0);
  local_9e0._M_dataplus._M_p = (pointer)&local_9e0.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_9e0,
             "0210fcaf81018c3f304ca792c9c1809ec00b159e23ebde669486c62787818f315c","");
  cfd::core::Pubkey::Pubkey(&local_750,&local_9e0);
  local_a00._M_dataplus._M_p = (pointer)&local_a00.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_a00,
             "020847e443a4d6b9ea577b776ca232c5dc9a3cbbd6c82dde0ef5100ac6c5a36cf9","");
  cfd::core::Pubkey::Pubkey(&local_738,&local_a00);
  local_a20._M_dataplus._M_p = (pointer)&local_a20.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_a20,
             "0289e210d82121823dc5af09a0ab8c23d4a52273358295f4e4596b0f98e4973e37","");
  cfd::core::Pubkey::Pubkey(&local_720,&local_a20);
  local_a40._M_dataplus._M_p = (pointer)&local_a40.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_a40,
             "0254de5471d6c8b36c26a62e0b54385fe0e88563e34127c18e97e705f83172326e","");
  cfd::core::Pubkey::Pubkey(&local_708,&local_a40);
  local_a60._M_dataplus._M_p = (pointer)&local_a60.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_a60,
             "03a9c473d65af0420e600e085be058f98ac0634d13390e5d8d4962cbcfeb75422b","");
  cfd::core::Pubkey::Pubkey(&local_6f0,&local_a60);
  local_a80._M_dataplus._M_p = (pointer)&local_a80.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_a80,
             "02ebcde0a7ece63e607287af1542efddeb008b0d1693da2ca06b622ebaf92051dd","");
  cfd::core::Pubkey::Pubkey(&local_6d8,&local_a80);
  local_aa0._M_dataplus._M_p = (pointer)&local_aa0.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_aa0,
             "0289b2b5852ffd7b89266338d746e05e7afe33e6005dab198b6a4b13065b93a89d","");
  cfd::core::Pubkey::Pubkey(&local_6c0,&local_aa0);
  local_ac0._M_dataplus._M_p = (pointer)&local_ac0.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_ac0,
             "0396436fd20f3c5d3638c8ed4195cf63b4467701c5d4de660bd9bced68f4588cd2","");
  cfd::core::Pubkey::Pubkey(&local_6a8,&local_ac0);
  local_ae0._M_dataplus._M_p = (pointer)&local_ae0.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_ae0,
             "025dffce0b5e131808a630d0d8769d22ead71fddf336836916c5906676e13394db","");
  cfd::core::Pubkey::Pubkey(&local_690,&local_ae0);
  __l_02._M_len = 0xf;
  __l_02._M_array = (iterator)local_7e0;
  std::vector<cfd::core::Pubkey,_std::allocator<cfd::core::Pubkey>_>::vector
            (&local_388,__l_02,&local_104c);
  local_1008._M_dataplus._M_p = (pointer)&local_1008.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_1008,
             "5c2102522952c3fc2a53a8651b08ce10988b7506a3b40a5c26f9648a911be33e73e1a0210340b52ae45bc1be5de083f1730fe537374e219c4836400623741d2a874e60590c21024a3477bc8b933a320eb5667ee72c35a81aa155c8e20cc51c65fb666de3a43b822103ce982e13798960b7c23fd2c1676f64ff6df80f75324d0e566432e2a884dafb3821020bac40bcc23dd9b33a32b8183d2e9e79eb976bcfb2247141da1e58b2970bfde1210289d8f0fb8cbd369a9aad28070edf2e99544384c122b8af825e50ea219193f147210210fcaf81018c3f304ca792c9c1809ec00b159e23ebde669486c62787818f315c21020847e443a4d6b9ea577b776ca232c5dc9a3cbbd6c82dde0ef5100ac6c5a36cf9210289e210d82121823dc5af09a0ab8c23d4a52273358295f4e4596b0f98e4973e37210254de5471d6c8b36c26a62e0b54385fe0e88563e34127c18e97e705f83172326e2103a9c473d65af0420e600e085be058f98ac0634d13390e5d8d4962cbcfeb75422b2102ebcde0a7ece63e607287af1542efddeb008b0d1693da2ca06b622ebaf92051dd210289b2b5852ffd7b89266338d746e05e7afe33e6005dab198b6a4b13065b93a89d210396436fd20f3c5d3638c8ed4195cf63b4467701c5d4de660bd9bced68f4588cd221025dffce0b5e131808a630d0d8769d22ead71fddf336836916c5906676e13394db5fae"
             ,"");
  cfd::core::Script::Script(&local_370,&local_1008);
  local_338[0] = local_328;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_338,"");
  local_318 = 0;
  local_310 = 0xf;
  local_b00._M_dataplus._M_p = (pointer)&local_b00.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_b00,
             "02522952c3fc2a53a8651b08ce10988b7506a3b40a5c26f9648a911be33e73e1a0","");
  cfd::core::Pubkey::Pubkey((Pubkey *)local_678,&local_b00);
  local_b20._M_dataplus._M_p = (pointer)&local_b20.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_b20,
             "0340b52ae45bc1be5de083f1730fe537374e219c4836400623741d2a874e60590c","");
  cfd::core::Pubkey::Pubkey((Pubkey *)(local_678 + 0x18),&local_b20);
  local_b40._M_dataplus._M_p = (pointer)&local_b40.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_b40,
             "024a3477bc8b933a320eb5667ee72c35a81aa155c8e20cc51c65fb666de3a43b82","");
  cfd::core::Pubkey::Pubkey(&local_648,&local_b40);
  local_b60._M_dataplus._M_p = (pointer)&local_b60.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_b60,
             "03ce982e13798960b7c23fd2c1676f64ff6df80f75324d0e566432e2a884dafb38","");
  cfd::core::Pubkey::Pubkey(&local_630,&local_b60);
  local_b80._M_dataplus._M_p = (pointer)&local_b80.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_b80,
             "020bac40bcc23dd9b33a32b8183d2e9e79eb976bcfb2247141da1e58b2970bfde1","");
  cfd::core::Pubkey::Pubkey(&local_618,&local_b80);
  local_ba0._M_dataplus._M_p = (pointer)&local_ba0.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_ba0,
             "0289d8f0fb8cbd369a9aad28070edf2e99544384c122b8af825e50ea219193f147","");
  cfd::core::Pubkey::Pubkey(&local_600,&local_ba0);
  local_bc0._M_dataplus._M_p = (pointer)&local_bc0.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_bc0,
             "0210fcaf81018c3f304ca792c9c1809ec00b159e23ebde669486c62787818f315c","");
  cfd::core::Pubkey::Pubkey(&local_5e8,&local_bc0);
  local_be0._M_dataplus._M_p = (pointer)&local_be0.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_be0,
             "020847e443a4d6b9ea577b776ca232c5dc9a3cbbd6c82dde0ef5100ac6c5a36cf9","");
  cfd::core::Pubkey::Pubkey(&local_5d0,&local_be0);
  local_c00._M_dataplus._M_p = (pointer)&local_c00.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_c00,
             "0289e210d82121823dc5af09a0ab8c23d4a52273358295f4e4596b0f98e4973e37","");
  cfd::core::Pubkey::Pubkey(&local_5b8,&local_c00);
  local_c20._M_dataplus._M_p = (pointer)&local_c20.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_c20,
             "0254de5471d6c8b36c26a62e0b54385fe0e88563e34127c18e97e705f83172326e","");
  cfd::core::Pubkey::Pubkey(&local_5a0,&local_c20);
  local_c40._M_dataplus._M_p = (pointer)&local_c40.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_c40,
             "03a9c473d65af0420e600e085be058f98ac0634d13390e5d8d4962cbcfeb75422b","");
  cfd::core::Pubkey::Pubkey(&local_588,&local_c40);
  local_c60._M_dataplus._M_p = (pointer)&local_c60.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_c60,
             "02ebcde0a7ece63e607287af1542efddeb008b0d1693da2ca06b622ebaf92051dd","");
  cfd::core::Pubkey::Pubkey(&local_570,&local_c60);
  local_c80._M_dataplus._M_p = (pointer)&local_c80.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_c80,
             "0289b2b5852ffd7b89266338d746e05e7afe33e6005dab198b6a4b13065b93a89d","");
  cfd::core::Pubkey::Pubkey(&local_558,&local_c80);
  local_ca0._M_dataplus._M_p = (pointer)&local_ca0.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_ca0,
             "0396436fd20f3c5d3638c8ed4195cf63b4467701c5d4de660bd9bced68f4588cd2","");
  cfd::core::Pubkey::Pubkey(&local_540,&local_ca0);
  local_cc0._M_dataplus._M_p = (pointer)&local_cc0.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_cc0,
             "025dffce0b5e131808a630d0d8769d22ead71fddf336836916c5906676e13394db","");
  cfd::core::Pubkey::Pubkey(&local_528,&local_cc0);
  __l_03._M_len = 0xf;
  __l_03._M_array = (iterator)local_678;
  std::vector<cfd::core::Pubkey,_std::allocator<cfd::core::Pubkey>_>::vector
            (&local_308,__l_03,&local_104d);
  local_1028._M_dataplus._M_p = (pointer)&local_1028.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_1028,
             "5f2102522952c3fc2a53a8651b08ce10988b7506a3b40a5c26f9648a911be33e73e1a0210340b52ae45bc1be5de083f1730fe537374e219c4836400623741d2a874e60590c21024a3477bc8b933a320eb5667ee72c35a81aa155c8e20cc51c65fb666de3a43b822103ce982e13798960b7c23fd2c1676f64ff6df80f75324d0e566432e2a884dafb3821020bac40bcc23dd9b33a32b8183d2e9e79eb976bcfb2247141da1e58b2970bfde1210289d8f0fb8cbd369a9aad28070edf2e99544384c122b8af825e50ea219193f147210210fcaf81018c3f304ca792c9c1809ec00b159e23ebde669486c62787818f315c21020847e443a4d6b9ea577b776ca232c5dc9a3cbbd6c82dde0ef5100ac6c5a36cf9210289e210d82121823dc5af09a0ab8c23d4a52273358295f4e4596b0f98e4973e37210254de5471d6c8b36c26a62e0b54385fe0e88563e34127c18e97e705f83172326e2103a9c473d65af0420e600e085be058f98ac0634d13390e5d8d4962cbcfeb75422b2102ebcde0a7ece63e607287af1542efddeb008b0d1693da2ca06b622ebaf92051dd210289b2b5852ffd7b89266338d746e05e7afe33e6005dab198b6a4b13065b93a89d210396436fd20f3c5d3638c8ed4195cf63b4467701c5d4de660bd9bced68f4588cd221025dffce0b5e131808a630d0d8769d22ead71fddf336836916c5906676e13394db5fae"
             ,"");
  cfd::core::Script::Script(&local_2f0,&local_1028);
  local_2b8[0] = local_2a8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_2b8,"");
  local_298 = 0;
  local_290 = 0x14;
  local_ce0._M_dataplus._M_p = (pointer)&local_ce0.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_ce0,
             "02522952c3fc2a53a8651b08ce10988b7506a3b40a5c26f9648a911be33e73e1a0","");
  cfd::core::Pubkey::Pubkey((Pubkey *)local_210,&local_ce0);
  local_d00._M_dataplus._M_p = (pointer)&local_d00.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_d00,
             "0340b52ae45bc1be5de083f1730fe537374e219c4836400623741d2a874e60590c","");
  cfd::core::Pubkey::Pubkey((Pubkey *)(local_210 + 0x18),&local_d00);
  local_d20._M_dataplus._M_p = (pointer)&local_d20.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_d20,
             "024a3477bc8b933a320eb5667ee72c35a81aa155c8e20cc51c65fb666de3a43b82","");
  cfd::core::Pubkey::Pubkey((Pubkey *)(local_210 + 0x30),&local_d20);
  local_d40._M_dataplus._M_p = (pointer)&local_d40.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_d40,
             "03ce982e13798960b7c23fd2c1676f64ff6df80f75324d0e566432e2a884dafb38","");
  cfd::core::Pubkey::Pubkey(&local_1c8,&local_d40);
  local_d60._M_dataplus._M_p = (pointer)&local_d60.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_d60,
             "020bac40bcc23dd9b33a32b8183d2e9e79eb976bcfb2247141da1e58b2970bfde1","");
  cfd::core::Pubkey::Pubkey(&local_1b0,&local_d60);
  local_d80._M_dataplus._M_p = (pointer)&local_d80.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_d80,
             "0289d8f0fb8cbd369a9aad28070edf2e99544384c122b8af825e50ea219193f147","");
  cfd::core::Pubkey::Pubkey(&local_198,&local_d80);
  local_da0._M_dataplus._M_p = (pointer)&local_da0.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_da0,
             "0210fcaf81018c3f304ca792c9c1809ec00b159e23ebde669486c62787818f315c","");
  cfd::core::Pubkey::Pubkey(&local_180,&local_da0);
  local_dc0._M_dataplus._M_p = (pointer)&local_dc0.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_dc0,
             "020847e443a4d6b9ea577b776ca232c5dc9a3cbbd6c82dde0ef5100ac6c5a36cf9","");
  cfd::core::Pubkey::Pubkey(&local_168,&local_dc0);
  local_de0._M_dataplus._M_p = (pointer)&local_de0.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_de0,
             "0289e210d82121823dc5af09a0ab8c23d4a52273358295f4e4596b0f98e4973e37","");
  cfd::core::Pubkey::Pubkey(&local_150,&local_de0);
  local_e00._M_dataplus._M_p = (pointer)&local_e00.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_e00,
             "0254de5471d6c8b36c26a62e0b54385fe0e88563e34127c18e97e705f83172326e","");
  cfd::core::Pubkey::Pubkey(&local_138,&local_e00);
  local_e20._M_dataplus._M_p = (pointer)&local_e20.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_e20,
             "03a9c473d65af0420e600e085be058f98ac0634d13390e5d8d4962cbcfeb75422b","");
  cfd::core::Pubkey::Pubkey(&local_120,&local_e20);
  local_e40._M_dataplus._M_p = (pointer)&local_e40.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_e40,
             "02ebcde0a7ece63e607287af1542efddeb008b0d1693da2ca06b622ebaf92051dd","");
  cfd::core::Pubkey::Pubkey(&local_108,&local_e40);
  local_e60._M_dataplus._M_p = (pointer)&local_e60.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_e60,
             "0289b2b5852ffd7b89266338d746e05e7afe33e6005dab198b6a4b13065b93a89d","");
  cfd::core::Pubkey::Pubkey(&local_f0,&local_e60);
  local_e80._M_dataplus._M_p = (pointer)&local_e80.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_e80,
             "0396436fd20f3c5d3638c8ed4195cf63b4467701c5d4de660bd9bced68f4588cd2","");
  cfd::core::Pubkey::Pubkey(&local_d8,&local_e80);
  local_ea0._M_dataplus._M_p = (pointer)&local_ea0.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_ea0,
             "025dffce0b5e131808a630d0d8769d22ead71fddf336836916c5906676e13394db","");
  cfd::core::Pubkey::Pubkey(&local_c0,&local_ea0);
  local_ec0._M_dataplus._M_p = (pointer)&local_ec0.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_ec0,
             "030023121bed4585fdfea023aee4c7f9731e3cfa6b2a8ec21a159615d2bad57e55","");
  cfd::core::Pubkey::Pubkey(&local_a8,&local_ec0);
  local_ee0._M_dataplus._M_p = (pointer)&local_ee0.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_ee0,
             "0267a49281bd9d6d366c39c62f2e95a2aab37638f2a4718891c542d0961962644e","");
  cfd::core::Pubkey::Pubkey(&local_90,&local_ee0);
  local_f00._M_dataplus._M_p = (pointer)&local_f00.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_f00,
             "02f48e8e2bcaeb16a6d781bb7a72f6250607bf21e32f08c48e37a9e4706e6d48b8","");
  cfd::core::Pubkey::Pubkey(&local_78,&local_f00);
  local_f20._M_dataplus._M_p = (pointer)&local_f20.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_f20,
             "03968ac57888ddaa3b57caa39efd5d5382c24f3deed602775cd4895f7c7adb5950","");
  cfd::core::Pubkey::Pubkey(&local_60,&local_f20);
  local_f40._M_dataplus._M_p = (pointer)&local_f40.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_f40,
             "024b64115bff6cc3718867114f7594fad535344f27ebe17ffa0e66288eb7bd2561","");
  cfd::core::Pubkey::Pubkey(&local_48,&local_f40);
  __l_04._M_len = 0x14;
  __l_04._M_array = (iterator)local_210;
  std::vector<cfd::core::Pubkey,_std::allocator<cfd::core::Pubkey>_>::vector
            (&local_288,__l_04,&local_104e);
  local_1048._M_dataplus._M_p = (pointer)&local_1048.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_1048,
             "01142102522952c3fc2a53a8651b08ce10988b7506a3b40a5c26f9648a911be33e73e1a0210340b52ae45bc1be5de083f1730fe537374e219c4836400623741d2a874e60590c21024a3477bc8b933a320eb5667ee72c35a81aa155c8e20cc51c65fb666de3a43b822103ce982e13798960b7c23fd2c1676f64ff6df80f75324d0e566432e2a884dafb3821020bac40bcc23dd9b33a32b8183d2e9e79eb976bcfb2247141da1e58b2970bfde1210289d8f0fb8cbd369a9aad28070edf2e99544384c122b8af825e50ea219193f147210210fcaf81018c3f304ca792c9c1809ec00b159e23ebde669486c62787818f315c21020847e443a4d6b9ea577b776ca232c5dc9a3cbbd6c82dde0ef5100ac6c5a36cf9210289e210d82121823dc5af09a0ab8c23d4a52273358295f4e4596b0f98e4973e37210254de5471d6c8b36c26a62e0b54385fe0e88563e34127c18e97e705f83172326e2103a9c473d65af0420e600e085be058f98ac0634d13390e5d8d4962cbcfeb75422b2102ebcde0a7ece63e607287af1542efddeb008b0d1693da2ca06b622ebaf92051dd210289b2b5852ffd7b89266338d746e05e7afe33e6005dab198b6a4b13065b93a89d210396436fd20f3c5d3638c8ed4195cf63b4467701c5d4de660bd9bced68f4588cd221025dffce0b5e131808a630d0d8769d22ead71fddf336836916c5906676e13394db21030023121bed4585fdfea023aee4c7f9731e3cfa6b2a8ec21a159615d2bad57e55210267a49281bd9d6d366c39c62f2e95a2aab37638f2a4718891c542d0961962644e2102f48e8e2bcaeb16a6d781bb7a72f6250607bf21e32f08c48e37a9e4706e6d48b82103968ac57888ddaa3b57caa39efd5d5382c24f3deed602775cd4895f7c7adb595021024b64115bff6cc3718867114f7594fad535344f27ebe17ffa0e66288eb7bd25610114ae"
             ,"");
  cfd::core::Script::Script(&local_270,&local_1048);
  puVar5 = local_228;
  local_238[0] = puVar5;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_238,"");
  local_218 = 1;
  __l_05._M_len = 6;
  __l_05._M_array = (iterator)local_510;
  std::vector<MultisigTestVector,_std::allocator<MultisigTestVector>_>::vector
            (&local_840,__l_05,&local_104f);
  lVar4 = -0x300;
  do {
    if (puVar5 != *(undefined1 **)(puVar5 + -0x10)) {
      operator_delete(*(undefined1 **)(puVar5 + -0x10));
    }
    cfd::core::Script::~Script((Script *)(puVar5 + -0x48));
    std::vector<cfd::core::Pubkey,_std::allocator<cfd::core::Pubkey>_>::~vector
              ((vector<cfd::core::Pubkey,_std::allocator<cfd::core::Pubkey>_> *)(puVar5 + -0x60));
    puVar5 = puVar5 + -0x80;
    lVar4 = lVar4 + 0x80;
  } while (lVar4 != 0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1048._M_dataplus._M_p != &local_1048.field_2) {
    operator_delete(local_1048._M_dataplus._M_p);
  }
  lVar4 = 0x1c8;
  do {
    if (*(void **)(local_210 + lVar4) != (void *)0x0) {
      operator_delete(*(void **)(local_210 + lVar4));
    }
    lVar4 = lVar4 + -0x18;
  } while (lVar4 != -0x18);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f40._M_dataplus._M_p != &local_f40.field_2) {
    operator_delete(local_f40._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f20._M_dataplus._M_p != &local_f20.field_2) {
    operator_delete(local_f20._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f00._M_dataplus._M_p != &local_f00.field_2) {
    operator_delete(local_f00._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_ee0._M_dataplus._M_p != &local_ee0.field_2) {
    operator_delete(local_ee0._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_ec0._M_dataplus._M_p != &local_ec0.field_2) {
    operator_delete(local_ec0._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_ea0._M_dataplus._M_p != &local_ea0.field_2) {
    operator_delete(local_ea0._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e80._M_dataplus._M_p != &local_e80.field_2) {
    operator_delete(local_e80._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e60._M_dataplus._M_p != &local_e60.field_2) {
    operator_delete(local_e60._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e40._M_dataplus._M_p != &local_e40.field_2) {
    operator_delete(local_e40._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e20._M_dataplus._M_p != &local_e20.field_2) {
    operator_delete(local_e20._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e00._M_dataplus._M_p != &local_e00.field_2) {
    operator_delete(local_e00._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_de0._M_dataplus._M_p != &local_de0.field_2) {
    operator_delete(local_de0._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_dc0._M_dataplus._M_p != &local_dc0.field_2) {
    operator_delete(local_dc0._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_da0._M_dataplus._M_p != &local_da0.field_2) {
    operator_delete(local_da0._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d80._M_dataplus._M_p != &local_d80.field_2) {
    operator_delete(local_d80._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d60._M_dataplus._M_p != &local_d60.field_2) {
    operator_delete(local_d60._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d40._M_dataplus._M_p != &local_d40.field_2) {
    operator_delete(local_d40._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d20._M_dataplus._M_p != &local_d20.field_2) {
    operator_delete(local_d20._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d00._M_dataplus._M_p != &local_d00.field_2) {
    operator_delete(local_d00._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_ce0._M_dataplus._M_p != &local_ce0.field_2) {
    operator_delete(local_ce0._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1028._M_dataplus._M_p != &local_1028.field_2) {
    operator_delete(local_1028._M_dataplus._M_p);
  }
  lVar4 = 0x150;
  do {
    if (*(void **)(local_678 + lVar4) != (void *)0x0) {
      operator_delete(*(void **)(local_678 + lVar4));
    }
    lVar4 = lVar4 + -0x18;
  } while (lVar4 != -0x18);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_cc0._M_dataplus._M_p != &local_cc0.field_2) {
    operator_delete(local_cc0._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_ca0._M_dataplus._M_p != &local_ca0.field_2) {
    operator_delete(local_ca0._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c80._M_dataplus._M_p != &local_c80.field_2) {
    operator_delete(local_c80._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c60._M_dataplus._M_p != &local_c60.field_2) {
    operator_delete(local_c60._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c40._M_dataplus._M_p != &local_c40.field_2) {
    operator_delete(local_c40._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c20._M_dataplus._M_p != &local_c20.field_2) {
    operator_delete(local_c20._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c00._M_dataplus._M_p != &local_c00.field_2) {
    operator_delete(local_c00._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_be0._M_dataplus._M_p != &local_be0.field_2) {
    operator_delete(local_be0._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_bc0._M_dataplus._M_p != &local_bc0.field_2) {
    operator_delete(local_bc0._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_ba0._M_dataplus._M_p != &local_ba0.field_2) {
    operator_delete(local_ba0._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b80._M_dataplus._M_p != &local_b80.field_2) {
    operator_delete(local_b80._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b60._M_dataplus._M_p != &local_b60.field_2) {
    operator_delete(local_b60._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b40._M_dataplus._M_p != &local_b40.field_2) {
    operator_delete(local_b40._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b20._M_dataplus._M_p != &local_b20.field_2) {
    operator_delete(local_b20._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b00._M_dataplus._M_p != &local_b00.field_2) {
    operator_delete(local_b00._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1008._M_dataplus._M_p != &local_1008.field_2) {
    operator_delete(local_1008._M_dataplus._M_p);
  }
  lVar4 = 0x150;
  do {
    if (*(void **)(local_7e0 + lVar4) != (void *)0x0) {
      operator_delete(*(void **)(local_7e0 + lVar4));
    }
    lVar4 = lVar4 + -0x18;
  } while (lVar4 != -0x18);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_ae0._M_dataplus._M_p != &local_ae0.field_2) {
    operator_delete(local_ae0._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_ac0._M_dataplus._M_p != &local_ac0.field_2) {
    operator_delete(local_ac0._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_aa0._M_dataplus._M_p != &local_aa0.field_2) {
    operator_delete(local_aa0._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a80._M_dataplus._M_p != &local_a80.field_2) {
    operator_delete(local_a80._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a60._M_dataplus._M_p != &local_a60.field_2) {
    operator_delete(local_a60._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a40._M_dataplus._M_p != &local_a40.field_2) {
    operator_delete(local_a40._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a20._M_dataplus._M_p != &local_a20.field_2) {
    operator_delete(local_a20._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a00._M_dataplus._M_p != &local_a00.field_2) {
    operator_delete(local_a00._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_9e0._M_dataplus._M_p != &local_9e0.field_2) {
    operator_delete(local_9e0._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_9c0._M_dataplus._M_p != &local_9c0.field_2) {
    operator_delete(local_9c0._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_9a0._M_dataplus._M_p != &local_9a0.field_2) {
    operator_delete(local_9a0._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_980._M_dataplus._M_p != &local_980.field_2) {
    operator_delete(local_980._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_960._M_dataplus._M_p != &local_960.field_2) {
    operator_delete(local_960._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_940._M_dataplus._M_p != &local_940.field_2) {
    operator_delete(local_940._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_920._M_dataplus._M_p != &local_920.field_2) {
    operator_delete(local_920._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_fe8._M_dataplus._M_p != &local_fe8.field_2) {
    operator_delete(local_fe8._M_dataplus._M_p);
  }
  lVar4 = 0x30;
  do {
    pvVar1 = *(void **)((long)&local_f88.data_.data_.
                               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                               _M_impl.super__Vector_impl_data._M_start + lVar4);
    if (pvVar1 != (void *)0x0) {
      operator_delete(pvVar1);
    }
    lVar4 = lVar4 + -0x18;
  } while (lVar4 != -0x18);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_900._M_dataplus._M_p != &local_900.field_2) {
    operator_delete(local_900._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_8e0._M_dataplus._M_p != &local_8e0.field_2) {
    operator_delete(local_8e0._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_8c0._M_dataplus._M_p != &local_8c0.field_2) {
    operator_delete(local_8c0._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_fc8._M_dataplus._M_p != &local_fc8.field_2) {
    operator_delete(local_fc8._M_dataplus._M_p);
  }
  lVar4 = 0x18;
  do {
    pvVar1 = *(void **)((long)&local_810.data_.data_.
                               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                               _M_impl.super__Vector_impl_data._M_start + lVar4);
    if (pvVar1 != (void *)0x0) {
      operator_delete(pvVar1);
    }
    lVar4 = lVar4 + -0x18;
  } while (lVar4 != -0x18);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_8a0._M_dataplus._M_p != &local_8a0.field_2) {
    operator_delete(local_8a0._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_880._M_dataplus._M_p != &local_880.field_2) {
    operator_delete(local_880._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_fa8._M_dataplus._M_p != &local_fa8.field_2) {
    operator_delete(local_fa8._M_dataplus._M_p);
  }
  if (local_828.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_828.data_.data_.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_860._M_dataplus._M_p != &local_860.field_2) {
    operator_delete(local_860._M_dataplus._M_p);
  }
  cfd::core::Script::Script((Script *)local_210);
  if (local_840.super__Vector_base<MultisigTestVector,_std::allocator<MultisigTestVector>_>._M_impl.
      super__Vector_impl_data._M_start !=
      local_840.super__Vector_base<MultisigTestVector,_std::allocator<MultisigTestVector>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    this_00 = (vector<cfd::core::Pubkey,_std::allocator<cfd::core::Pubkey>_> *)(local_510 + 8);
    this_01 = (Script *)(local_510 + 0x20);
    pMVar6 = local_840.super__Vector_base<MultisigTestVector,_std::allocator<MultisigTestVector>_>.
             _M_impl.super__Vector_impl_data._M_start;
    do {
      local_510._0_4_ = pMVar6->req_sig;
      std::vector<cfd::core::Pubkey,_std::allocator<cfd::core::Pubkey>_>::vector
                (this_00,&pMVar6->input_pubkeys);
      cfd::core::Script::Script(this_01,&pMVar6->expect_multisig_script);
      local_4b8._M_p = local_4a8;
      pcVar2 = (pMVar6->expect_message)._M_dataplus._M_p;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_4b8,pcVar2,pcVar2 + (pMVar6->expect_message)._M_string_length);
      local_498 = pMVar6->is_witness;
      cfd::core::ScriptUtil::CreateMultisigRedeemScript
                ((Script *)local_7e0,local_510._0_4_,this_00,local_498);
      cfd::core::Script::operator=((Script *)local_210,(Script *)local_7e0);
      cfd::core::Script::~Script((Script *)local_7e0);
      cfd::core::Script::GetHex_abi_cxx11_((string *)local_7e0,(Script *)local_210);
      lhs = local_7e0._0_8_;
      cfd::core::Script::GetHex_abi_cxx11_((string *)local_678,this_01);
      testing::internal::CmpHelperSTREQ
                ((internal *)&local_f88,"actual.GetHex().c_str()",
                 "test_vector.expect_multisig_script.GetHex().c_str()",(char *)lhs,
                 (char *)local_678._0_8_);
      if ((undefined1 *)local_678._0_8_ != local_678 + 0x10) {
        operator_delete((void *)local_678._0_8_);
      }
      if ((undefined1 *)local_7e0._0_8_ != local_7e0 + 0x10) {
        operator_delete((void *)local_7e0._0_8_);
      }
      if (local_f88.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
          _M_impl.super__Vector_impl_data._M_start._0_1_ == (internal)0x0) {
        testing::Message::Message((Message *)local_7e0);
        message = "";
        if (local_f88.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
            _M_impl.super__Vector_impl_data._M_finish != (pointer)0x0) {
          message = *(char **)local_f88.data_.data_.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_finish;
        }
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)local_678,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_scriptutil.cpp"
                   ,0x127,message);
        testing::internal::AssertHelper::operator=((AssertHelper *)local_678,(Message *)local_7e0);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_678);
        if ((((_func_int **)local_7e0._0_8_ != (_func_int **)0x0) &&
            (bVar3 = testing::internal::IsTrue(true), bVar3)) &&
           ((_func_int **)local_7e0._0_8_ != (_func_int **)0x0)) {
          (**(code **)(*(_func_int **)local_7e0._0_8_ + 8))();
        }
      }
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)((long)&local_f88.data_.data_.
                       super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                       super__Vector_impl_data + 8),
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
      if (local_4b8._M_p != local_4a8) {
        operator_delete(local_4b8._M_p);
      }
      cfd::core::Script::~Script(this_01);
      std::vector<cfd::core::Pubkey,_std::allocator<cfd::core::Pubkey>_>::~vector(this_00);
      pMVar6 = pMVar6 + 1;
    } while (pMVar6 != local_840.
                       super__Vector_base<MultisigTestVector,_std::allocator<MultisigTestVector>_>.
                       _M_impl.super__Vector_impl_data._M_finish);
  }
  cfd::core::Script::~Script((Script *)local_210);
  std::vector<MultisigTestVector,_std::allocator<MultisigTestVector>_>::~vector(&local_840);
  return;
}

Assistant:

TEST(ScriptUtil, CreateMultisigRedeemScriptTest) {
  const std::vector<MultisigTestVector> test_vectors = {
    // 1-of-1 Multisig
    {
      1,
      {
        Pubkey("02522952c3fc2a53a8651b08ce10988b7506a3b40a5c26f9648a911be33e73e1a0"),
      },
      Script("512102522952c3fc2a53a8651b08ce10988b7506a3b40a5c26f9648a911be33e73e1a051ae"),
      "",
      false
    },
    // 1-of-2 Multisig
    {
      1,
      {
        Pubkey("02522952c3fc2a53a8651b08ce10988b7506a3b40a5c26f9648a911be33e73e1a0"),
        Pubkey("0340b52ae45bc1be5de083f1730fe537374e219c4836400623741d2a874e60590c"),
      },
      Script("512102522952c3fc2a53a8651b08ce10988b7506a3b40a5c26f9648a911be33e73e1a0210340b52ae45bc1be5de083f1730fe537374e219c4836400623741d2a874e60590c52ae"),
      "",
      false
    },
    // 2-of-3 Multisig
    {
      2,
      {
        Pubkey("02522952c3fc2a53a8651b08ce10988b7506a3b40a5c26f9648a911be33e73e1a0"),
        Pubkey("0340b52ae45bc1be5de083f1730fe537374e219c4836400623741d2a874e60590c"),
        Pubkey("024a3477bc8b933a320eb5667ee72c35a81aa155c8e20cc51c65fb666de3a43b82"),
      },
      Script("522102522952c3fc2a53a8651b08ce10988b7506a3b40a5c26f9648a911be33e73e1a0210340b52ae45bc1be5de083f1730fe537374e219c4836400623741d2a874e60590c21024a3477bc8b933a320eb5667ee72c35a81aa155c8e20cc51c65fb666de3a43b8253ae"),
      "",
      false
    },
    // 12-of-15 Multisig
    {
      12,
      {
        Pubkey("02522952c3fc2a53a8651b08ce10988b7506a3b40a5c26f9648a911be33e73e1a0"),
        Pubkey("0340b52ae45bc1be5de083f1730fe537374e219c4836400623741d2a874e60590c"),
        Pubkey("024a3477bc8b933a320eb5667ee72c35a81aa155c8e20cc51c65fb666de3a43b82"),
        Pubkey("03ce982e13798960b7c23fd2c1676f64ff6df80f75324d0e566432e2a884dafb38"),
        Pubkey("020bac40bcc23dd9b33a32b8183d2e9e79eb976bcfb2247141da1e58b2970bfde1"),
        Pubkey("0289d8f0fb8cbd369a9aad28070edf2e99544384c122b8af825e50ea219193f147"),
        Pubkey("0210fcaf81018c3f304ca792c9c1809ec00b159e23ebde669486c62787818f315c"),
        Pubkey("020847e443a4d6b9ea577b776ca232c5dc9a3cbbd6c82dde0ef5100ac6c5a36cf9"),
        Pubkey("0289e210d82121823dc5af09a0ab8c23d4a52273358295f4e4596b0f98e4973e37"),
        Pubkey("0254de5471d6c8b36c26a62e0b54385fe0e88563e34127c18e97e705f83172326e"),
        Pubkey("03a9c473d65af0420e600e085be058f98ac0634d13390e5d8d4962cbcfeb75422b"),
        Pubkey("02ebcde0a7ece63e607287af1542efddeb008b0d1693da2ca06b622ebaf92051dd"),
        Pubkey("0289b2b5852ffd7b89266338d746e05e7afe33e6005dab198b6a4b13065b93a89d"),
        Pubkey("0396436fd20f3c5d3638c8ed4195cf63b4467701c5d4de660bd9bced68f4588cd2"),
        Pubkey("025dffce0b5e131808a630d0d8769d22ead71fddf336836916c5906676e13394db"),
      },
      Script("5c2102522952c3fc2a53a8651b08ce10988b7506a3b40a5c26f9648a911be33e73e1a0210340b52ae45bc1be5de083f1730fe537374e219c4836400623741d2a874e60590c21024a3477bc8b933a320eb5667ee72c35a81aa155c8e20cc51c65fb666de3a43b822103ce982e13798960b7c23fd2c1676f64ff6df80f75324d0e566432e2a884dafb3821020bac40bcc23dd9b33a32b8183d2e9e79eb976bcfb2247141da1e58b2970bfde1210289d8f0fb8cbd369a9aad28070edf2e99544384c122b8af825e50ea219193f147210210fcaf81018c3f304ca792c9c1809ec00b159e23ebde669486c62787818f315c21020847e443a4d6b9ea577b776ca232c5dc9a3cbbd6c82dde0ef5100ac6c5a36cf9210289e210d82121823dc5af09a0ab8c23d4a52273358295f4e4596b0f98e4973e37210254de5471d6c8b36c26a62e0b54385fe0e88563e34127c18e97e705f83172326e2103a9c473d65af0420e600e085be058f98ac0634d13390e5d8d4962cbcfeb75422b2102ebcde0a7ece63e607287af1542efddeb008b0d1693da2ca06b622ebaf92051dd210289b2b5852ffd7b89266338d746e05e7afe33e6005dab198b6a4b13065b93a89d210396436fd20f3c5d3638c8ed4195cf63b4467701c5d4de660bd9bced68f4588cd221025dffce0b5e131808a630d0d8769d22ead71fddf336836916c5906676e13394db5fae"),
      "",
      false
    },
    // 15-of-15 Multisig
    {
      15,
      {
        Pubkey("02522952c3fc2a53a8651b08ce10988b7506a3b40a5c26f9648a911be33e73e1a0"),
        Pubkey("0340b52ae45bc1be5de083f1730fe537374e219c4836400623741d2a874e60590c"),
        Pubkey("024a3477bc8b933a320eb5667ee72c35a81aa155c8e20cc51c65fb666de3a43b82"),
        Pubkey("03ce982e13798960b7c23fd2c1676f64ff6df80f75324d0e566432e2a884dafb38"),
        Pubkey("020bac40bcc23dd9b33a32b8183d2e9e79eb976bcfb2247141da1e58b2970bfde1"),
        Pubkey("0289d8f0fb8cbd369a9aad28070edf2e99544384c122b8af825e50ea219193f147"),
        Pubkey("0210fcaf81018c3f304ca792c9c1809ec00b159e23ebde669486c62787818f315c"),
        Pubkey("020847e443a4d6b9ea577b776ca232c5dc9a3cbbd6c82dde0ef5100ac6c5a36cf9"),
        Pubkey("0289e210d82121823dc5af09a0ab8c23d4a52273358295f4e4596b0f98e4973e37"),
        Pubkey("0254de5471d6c8b36c26a62e0b54385fe0e88563e34127c18e97e705f83172326e"),
        Pubkey("03a9c473d65af0420e600e085be058f98ac0634d13390e5d8d4962cbcfeb75422b"),
        Pubkey("02ebcde0a7ece63e607287af1542efddeb008b0d1693da2ca06b622ebaf92051dd"),
        Pubkey("0289b2b5852ffd7b89266338d746e05e7afe33e6005dab198b6a4b13065b93a89d"),
        Pubkey("0396436fd20f3c5d3638c8ed4195cf63b4467701c5d4de660bd9bced68f4588cd2"),
        Pubkey("025dffce0b5e131808a630d0d8769d22ead71fddf336836916c5906676e13394db"),
      },
      Script("5f2102522952c3fc2a53a8651b08ce10988b7506a3b40a5c26f9648a911be33e73e1a0210340b52ae45bc1be5de083f1730fe537374e219c4836400623741d2a874e60590c21024a3477bc8b933a320eb5667ee72c35a81aa155c8e20cc51c65fb666de3a43b822103ce982e13798960b7c23fd2c1676f64ff6df80f75324d0e566432e2a884dafb3821020bac40bcc23dd9b33a32b8183d2e9e79eb976bcfb2247141da1e58b2970bfde1210289d8f0fb8cbd369a9aad28070edf2e99544384c122b8af825e50ea219193f147210210fcaf81018c3f304ca792c9c1809ec00b159e23ebde669486c62787818f315c21020847e443a4d6b9ea577b776ca232c5dc9a3cbbd6c82dde0ef5100ac6c5a36cf9210289e210d82121823dc5af09a0ab8c23d4a52273358295f4e4596b0f98e4973e37210254de5471d6c8b36c26a62e0b54385fe0e88563e34127c18e97e705f83172326e2103a9c473d65af0420e600e085be058f98ac0634d13390e5d8d4962cbcfeb75422b2102ebcde0a7ece63e607287af1542efddeb008b0d1693da2ca06b622ebaf92051dd210289b2b5852ffd7b89266338d746e05e7afe33e6005dab198b6a4b13065b93a89d210396436fd20f3c5d3638c8ed4195cf63b4467701c5d4de660bd9bced68f4588cd221025dffce0b5e131808a630d0d8769d22ead71fddf336836916c5906676e13394db5fae"),
      "",
      false
    },
    // 20-of-20 Multisig on witness
    {
      20,
      {
        Pubkey("02522952c3fc2a53a8651b08ce10988b7506a3b40a5c26f9648a911be33e73e1a0"),
        Pubkey("0340b52ae45bc1be5de083f1730fe537374e219c4836400623741d2a874e60590c"),
        Pubkey("024a3477bc8b933a320eb5667ee72c35a81aa155c8e20cc51c65fb666de3a43b82"),
        Pubkey("03ce982e13798960b7c23fd2c1676f64ff6df80f75324d0e566432e2a884dafb38"),
        Pubkey("020bac40bcc23dd9b33a32b8183d2e9e79eb976bcfb2247141da1e58b2970bfde1"),
        Pubkey("0289d8f0fb8cbd369a9aad28070edf2e99544384c122b8af825e50ea219193f147"),
        Pubkey("0210fcaf81018c3f304ca792c9c1809ec00b159e23ebde669486c62787818f315c"),
        Pubkey("020847e443a4d6b9ea577b776ca232c5dc9a3cbbd6c82dde0ef5100ac6c5a36cf9"),
        Pubkey("0289e210d82121823dc5af09a0ab8c23d4a52273358295f4e4596b0f98e4973e37"),
        Pubkey("0254de5471d6c8b36c26a62e0b54385fe0e88563e34127c18e97e705f83172326e"),
        Pubkey("03a9c473d65af0420e600e085be058f98ac0634d13390e5d8d4962cbcfeb75422b"),
        Pubkey("02ebcde0a7ece63e607287af1542efddeb008b0d1693da2ca06b622ebaf92051dd"),
        Pubkey("0289b2b5852ffd7b89266338d746e05e7afe33e6005dab198b6a4b13065b93a89d"),
        Pubkey("0396436fd20f3c5d3638c8ed4195cf63b4467701c5d4de660bd9bced68f4588cd2"),
        Pubkey("025dffce0b5e131808a630d0d8769d22ead71fddf336836916c5906676e13394db"),
        Pubkey("030023121bed4585fdfea023aee4c7f9731e3cfa6b2a8ec21a159615d2bad57e55"),
        Pubkey("0267a49281bd9d6d366c39c62f2e95a2aab37638f2a4718891c542d0961962644e"),
        Pubkey("02f48e8e2bcaeb16a6d781bb7a72f6250607bf21e32f08c48e37a9e4706e6d48b8"),
        Pubkey("03968ac57888ddaa3b57caa39efd5d5382c24f3deed602775cd4895f7c7adb5950"),
        Pubkey("024b64115bff6cc3718867114f7594fad535344f27ebe17ffa0e66288eb7bd2561"),
      },
      Script("01142102522952c3fc2a53a8651b08ce10988b7506a3b40a5c26f9648a911be33e73e1a0210340b52ae45bc1be5de083f1730fe537374e219c4836400623741d2a874e60590c21024a3477bc8b933a320eb5667ee72c35a81aa155c8e20cc51c65fb666de3a43b822103ce982e13798960b7c23fd2c1676f64ff6df80f75324d0e566432e2a884dafb3821020bac40bcc23dd9b33a32b8183d2e9e79eb976bcfb2247141da1e58b2970bfde1210289d8f0fb8cbd369a9aad28070edf2e99544384c122b8af825e50ea219193f147210210fcaf81018c3f304ca792c9c1809ec00b159e23ebde669486c62787818f315c21020847e443a4d6b9ea577b776ca232c5dc9a3cbbd6c82dde0ef5100ac6c5a36cf9210289e210d82121823dc5af09a0ab8c23d4a52273358295f4e4596b0f98e4973e37210254de5471d6c8b36c26a62e0b54385fe0e88563e34127c18e97e705f83172326e2103a9c473d65af0420e600e085be058f98ac0634d13390e5d8d4962cbcfeb75422b2102ebcde0a7ece63e607287af1542efddeb008b0d1693da2ca06b622ebaf92051dd210289b2b5852ffd7b89266338d746e05e7afe33e6005dab198b6a4b13065b93a89d210396436fd20f3c5d3638c8ed4195cf63b4467701c5d4de660bd9bced68f4588cd221025dffce0b5e131808a630d0d8769d22ead71fddf336836916c5906676e13394db21030023121bed4585fdfea023aee4c7f9731e3cfa6b2a8ec21a159615d2bad57e55210267a49281bd9d6d366c39c62f2e95a2aab37638f2a4718891c542d0961962644e2102f48e8e2bcaeb16a6d781bb7a72f6250607bf21e32f08c48e37a9e4706e6d48b82103968ac57888ddaa3b57caa39efd5d5382c24f3deed602775cd4895f7c7adb595021024b64115bff6cc3718867114f7594fad535344f27ebe17ffa0e66288eb7bd25610114ae"),
      "",
      true
    },
  };

  Script actual;
  for (MultisigTestVector test_vector : test_vectors) {
    try {
      actual = ScriptUtil::CreateMultisigRedeemScript(
          test_vector.req_sig, test_vector.input_pubkeys,
          test_vector.is_witness);
      EXPECT_STREQ(actual.GetHex().c_str(), test_vector.expect_multisig_script.GetHex().c_str());
    } catch (const CfdException& except) {
      EXPECT_STREQ(except.what(), "");
      EXPECT_EQ(test_vector.req_sig, 0);
    }
  }
}